

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O1

IRet * __thiscall
deqp::gls::BuiltinPrecisionTests::Functions::Modf::doApply
          (IRet *__return_storage_ptr__,Modf *this,EvalContext *param_1,IArgs *iargs)

{
  Interval *pIVar1;
  Interval *pIVar2;
  bool bVar3;
  Interval *whole_dst_;
  Interval *whole_arg_;
  ulong uVar4;
  double dVar5;
  double dVar6;
  undefined8 extraout_XMM0_Qb;
  double dVar7;
  double dVar8;
  double dVar9;
  double x_1;
  double intPart;
  double x;
  double local_80;
  double local_78;
  undefined8 uStack_70;
  double local_68;
  undefined8 uStack_60;
  double local_58;
  double local_48;
  undefined8 uStack_40;
  
  __return_storage_ptr__->m_hasNaN = false;
  __return_storage_ptr__->m_lo = INFINITY;
  __return_storage_ptr__->m_hi = -INFINITY;
  pIVar1 = iargs->b;
  local_80 = 0.0;
  pIVar2 = iargs->a;
  dVar6 = pIVar2->m_lo;
  dVar8 = pIVar2->m_hi;
  if (dVar6 <= dVar8) {
    local_68 = dVar6;
    local_58 = modf(dVar6,&local_80);
    uStack_40 = 0;
    local_48 = INFINITY;
    if (!NAN(local_58)) {
      local_48 = local_58;
      uStack_40 = extraout_XMM0_Qb;
    }
    local_78 = (double)(-(ulong)NAN(local_58) & 0xfff0000000000000 |
                       ~-(ulong)NAN(local_58) & (ulong)local_58);
    uStack_70 = 0;
    dVar5 = modf(dVar8,&local_80);
    dVar6 = INFINITY;
    if (!NAN(dVar5)) {
      dVar6 = dVar5;
    }
    dVar7 = (double)(-(ulong)NAN(dVar5) & 0xfff0000000000000 | ~-(ulong)NAN(dVar5) & (ulong)dVar5);
    bVar3 = NAN(local_58) || NAN(dVar5);
    dVar9 = (double)(~-(ulong)(local_48 <= dVar6) & (ulong)dVar6 |
                    (ulong)local_48 & -(ulong)(local_48 <= dVar6));
    uVar4 = -(ulong)(dVar7 <= local_78);
    dVar5 = (double)(~uVar4 & (ulong)dVar7 | uVar4 & (ulong)local_78);
    dVar6 = local_68;
  }
  else {
    dVar5 = -INFINITY;
    dVar9 = INFINITY;
    bVar3 = false;
  }
  __return_storage_ptr__->m_hasNaN = bVar3;
  __return_storage_ptr__->m_lo = dVar9;
  __return_storage_ptr__->m_hi = dVar5;
  if (pIVar2->m_hasNaN == true) {
    dVar5 = __return_storage_ptr__->m_lo;
    dVar7 = __return_storage_ptr__->m_hi;
    if (INFINITY <= dVar5) {
      dVar5 = INFINITY;
    }
    if (dVar7 <= -INFINITY) {
      dVar7 = -INFINITY;
    }
    __return_storage_ptr__->m_hasNaN = true;
    __return_storage_ptr__->m_lo = dVar5;
    __return_storage_ptr__->m_hi = dVar7;
  }
  if (dVar6 <= dVar8) {
    modf(dVar6,&local_80);
    bVar3 = NAN(local_80);
    local_78 = INFINITY;
    if (!bVar3) {
      local_78 = local_80;
    }
    uStack_70 = 0;
    local_68 = -INFINITY;
    if (!bVar3) {
      local_68 = local_80;
    }
    uStack_60 = 0;
    modf(dVar8,&local_80);
    dVar8 = -INFINITY;
    dVar6 = INFINITY;
    if (!NAN(local_80)) {
      dVar8 = local_80;
      dVar6 = local_80;
    }
    bVar3 = bVar3 || NAN(local_80);
    dVar6 = (double)(~-(ulong)(local_78 <= dVar6) & (ulong)dVar6 |
                    (ulong)local_78 & -(ulong)(local_78 <= dVar6));
    dVar8 = (double)(~-(ulong)(dVar8 <= local_68) & (ulong)dVar8 |
                    (ulong)local_68 & -(ulong)(dVar8 <= local_68));
  }
  else {
    dVar8 = -INFINITY;
    dVar6 = INFINITY;
    bVar3 = false;
  }
  pIVar1->m_hasNaN = bVar3;
  pIVar1->m_lo = dVar6;
  pIVar1->m_hi = dVar8;
  if (pIVar2->m_hasNaN == true) {
    dVar8 = pIVar1->m_lo;
    dVar6 = pIVar1->m_hi;
    if (INFINITY <= dVar8) {
      dVar8 = INFINITY;
    }
    if (dVar6 <= -INFINITY) {
      dVar6 = -INFINITY;
    }
    pIVar1->m_hasNaN = true;
    pIVar1->m_lo = dVar8;
    pIVar1->m_hi = dVar6;
  }
  if ((iargs->a->m_lo == -INFINITY) || (iargs->a->m_hi == INFINITY)) {
    dVar8 = __return_storage_ptr__->m_lo;
    dVar6 = __return_storage_ptr__->m_hi;
    if (INFINITY <= dVar8) {
      dVar8 = INFINITY;
    }
    if (dVar6 <= -INFINITY) {
      dVar6 = -INFINITY;
    }
    __return_storage_ptr__->m_hasNaN = true;
    __return_storage_ptr__->m_lo = dVar8;
    __return_storage_ptr__->m_hi = dVar6;
  }
  return __return_storage_ptr__;
}

Assistant:

IRet	doApply				(const EvalContext&, const IArgs& iargs) const
	{
		Interval	fracIV;
		Interval&	wholeIV		= const_cast<Interval&>(iargs.b);
		double		intPart		= 0;

		TCU_INTERVAL_APPLY_MONOTONE1(fracIV, x, iargs.a, frac, frac = deModf(x, &intPart));
		TCU_INTERVAL_APPLY_MONOTONE1(wholeIV, x, iargs.a, whole,
									 deModf(x, &intPart); whole = intPart);

		if (!iargs.a.isFinite())
		{
			// Behavior on modf(Inf) not well-defined, allow anything as a fractional part
			// See Khronos bug 13907
			fracIV |= TCU_NAN;
		}

		return fracIV;
	}